

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyboard.c
# Opt level: O2

void keyboard_event(ALLEGRO_EVENT *event)

{
  ALLEGRO_EVENT_TYPE AVar1;
  long lVar2;
  
  AVar1 = event->type;
  if (AVar1 == 0xc) {
    key_array[(event->display).width] = key_array[(event->display).width] & 0xfffffffaU | 4;
  }
  else if (AVar1 == 0xb) {
    if (unicode_count < 0x10 && (event->display).height != 0) {
      lVar2 = (long)unicode_count;
      unicode_count = unicode_count + 1;
      unicode_array[lVar2] = (event->display).height;
      return;
    }
  }
  else if (AVar1 == 10) {
    key_array[(event->display).width] = key_array[(event->display).width] | 3;
    return;
  }
  return;
}

Assistant:

void keyboard_event(ALLEGRO_EVENT *event)
{
   switch (event->type) {
      case ALLEGRO_EVENT_KEY_DOWN:
         key_array[event->keyboard.keycode] |= (1 << 0);
         key_array[event->keyboard.keycode] |= (1 << 1);
         break;

      case ALLEGRO_EVENT_KEY_CHAR:
         if (event->keyboard.unichar && unicode_count < KEYBUF_SIZE) {
            unicode_array[unicode_count++] = event->keyboard.unichar;
         }
         break;

      case ALLEGRO_EVENT_KEY_UP:
         key_array[event->keyboard.keycode] &= ~(1 << 0);
         key_array[event->keyboard.keycode] |= (1 << 2);
         break;
   }
}